

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

BuiltinFunction Func::GetBuiltInIndex(Opnd *opnd)

{
  _func_int **pp_Var1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  OpndKind OVar5;
  BuiltinFunction BVar6;
  byte bVar7;
  undefined4 *puVar8;
  
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x36c,"(opnd)","opnd");
    if (!bVar3) goto LAB_005602e8;
    *puVar8 = 0;
  }
  OVar4 = IR::Opnd::GetKind(opnd);
  OVar5 = IR::Opnd::GetKind(opnd);
  if (OVar4 == OpndKindReg) {
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) {
LAB_005602e8:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    bVar7 = *(byte *)((long)opnd[1]._vptr_Opnd + 0x1d);
  }
  else {
    bVar7 = 'H';
    if (OVar5 == OpndKindSym) {
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_005602e8;
        *puVar8 = 0;
      }
      pp_Var1 = opnd[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x02') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar3) goto LAB_005602e8;
        *puVar8 = 0;
      }
      BVar6 = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(*(PropertyId *)(pp_Var1 + 3));
      return (BuiltinFunction)BVar6._value;
    }
  }
  return (BuiltinFunction)bVar7;
}

Assistant:

static Js::BuiltinFunction GetBuiltInIndex(IR::Opnd* opnd)
    {
        Assert(opnd);
        Js::BuiltinFunction index;
        if (opnd->IsRegOpnd())
        {
            index = opnd->AsRegOpnd()->m_sym->m_builtInIndex;
        }
        else if (opnd->IsSymOpnd())
        {
            PropertySym *propertySym = opnd->AsSymOpnd()->m_sym->AsPropertySym();
            index = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(propertySym->m_propertyId);
        }
        else
        {
            index = Js::BuiltinFunction::None;
        }
        return index;
    }